

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

bool EqualRegion(QRegionPrivate *r1,QRegionPrivate *r2)

{
  bool bVar1;
  int iVar2;
  int i;
  int iVar3;
  QRect *lhs;
  QRect *rhs;
  
  if (r1->numRects != r2->numRects) {
    return false;
  }
  if (r1->numRects == 0) {
    return true;
  }
  lhs = &r1->extents;
  rhs = &r2->extents;
  bVar1 = operator!=(lhs,rhs);
  if (bVar1) {
    return false;
  }
  iVar2 = r1->numRects;
  if (iVar2 == 1) {
    if (r2->numRects == 1) {
      return true;
    }
  }
  else {
    lhs = (r1->rects).d.ptr;
    if (r2->numRects == 1) goto LAB_003d33b3;
  }
  rhs = (r2->rects).d.ptr;
LAB_003d33b3:
  iVar3 = 0;
  while ((iVar3 < iVar2 && (bVar1 = operator!=(lhs,rhs), !bVar1))) {
    iVar3 = iVar3 + 1;
    lhs = lhs + 1;
    rhs = rhs + 1;
    iVar2 = r1->numRects;
  }
  return iVar2 <= iVar3;
}

Assistant:

static bool EqualRegion(const QRegionPrivate *r1, const QRegionPrivate *r2)
{
    if (r1->numRects != r2->numRects) {
        return false;
    } else if (r1->numRects == 0) {
        return true;
    } else if (r1->extents != r2->extents) {
        return false;
    } else if (r1->numRects == 1 && r2->numRects == 1) {
        return true; // equality tested in previous if-statement
    } else {
        const QRect *rr1 = (r1->numRects == 1) ? &r1->extents : r1->rects.constData();
        const QRect *rr2 = (r2->numRects == 1) ? &r2->extents : r2->rects.constData();
        for (int i = 0; i < r1->numRects; ++i, ++rr1, ++rr2) {
            if (*rr1 != *rr2)
                return false;
        }
    }

    return true;
}